

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O3

void spvtools::Logf<char_const*>
               (MessageConsumer *consumer,spv_message_level_t level,char *source,
               spv_position_t *position,char *format,char **args)

{
  uint uVar1;
  vector<char,_std::allocator<char>_> longer_message;
  char message [256];
  allocator_type local_159;
  spv_position_t *local_158;
  vector<char,_std::allocator<char>_> local_150;
  char local_138 [264];
  
  uVar1 = snprintf(local_138,0x100,format,*args);
  if (uVar1 < 0x100) {
    if ((consumer->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(consumer,level,source,position,local_138);
    }
  }
  else if ((int)uVar1 < 0) {
    if ((consumer->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(consumer,level,source,position,"cannot compose log message");
      return;
    }
  }
  else {
    local_158 = position;
    std::vector<char,_std::allocator<char>_>::vector(&local_150,(ulong)(uVar1 + 1),&local_159);
    snprintf(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,format,*args);
    if ((consumer->super__Function_base)._M_manager != (_Manager_type)0x0) {
      std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
      ::operator()(consumer,level,source,local_158,
                   local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    }
    if (local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Logf(const MessageConsumer& consumer, spv_message_level_t level,
          const char* source, const spv_position_t& position,
          const char* format, Args&&... args) {
#if defined(_MSC_VER) && _MSC_VER < 1900
// Sadly, snprintf() is not supported until Visual Studio 2015!
#define snprintf _snprintf
#endif

  enum { kInitBufferSize = 256 };

  char message[kInitBufferSize];
  const int size =
      snprintf(message, kInitBufferSize, format, std::forward<Args>(args)...);

  if (size >= 0 && size < kInitBufferSize) {
    Log(consumer, level, source, position, message);
    return;
  }

  if (size >= 0) {
    // The initial buffer is insufficient.  Allocate a buffer of a larger size,
    // and write to it instead.  Force the size to be unsigned to avoid a
    // warning in GCC 7.1.
    std::vector<char> longer_message(size + 1u);
    snprintf(longer_message.data(), longer_message.size(), format,
             std::forward<Args>(args)...);
    Log(consumer, level, source, position, longer_message.data());
    return;
  }

  Log(consumer, level, source, position, "cannot compose log message");

#if defined(_MSC_VER) && _MSC_VER < 1900
#undef snprintf
#endif
}